

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  AABBNodeMB4D *node1;
  ulong uVar64;
  long lVar65;
  byte bVar66;
  uint uVar67;
  int iVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar148;
  float fVar149;
  undefined1 auVar145 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [32];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar174 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar183 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1928;
  undefined1 local_1890 [16];
  undefined1 (*local_1880) [16];
  long local_1878;
  long local_1870;
  ulong local_1868;
  ulong local_1860;
  long local_1858;
  ulong local_1850;
  ulong local_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  RTCHitN local_14d0 [16];
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  undefined4 uStack_14b4;
  undefined4 local_14b0;
  undefined4 uStack_14ac;
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined4 local_14a0;
  undefined4 uStack_149c;
  undefined4 uStack_1498;
  undefined4 uStack_1494;
  undefined1 local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  uint local_1460;
  uint uStack_145c;
  uint uStack_1458;
  uint uStack_1454;
  uint uStack_1450;
  uint uStack_144c;
  uint uStack_1448;
  uint uStack_1444;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined4 uStack_1424;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_16c0._4_4_ = uVar1;
  local_16c0._0_4_ = uVar1;
  local_16c0._8_4_ = uVar1;
  local_16c0._12_4_ = uVar1;
  local_16c0._16_4_ = uVar1;
  local_16c0._20_4_ = uVar1;
  local_16c0._24_4_ = uVar1;
  local_16c0._28_4_ = uVar1;
  auVar131 = ZEXT3264(local_16c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_16e0._4_4_ = uVar1;
  local_16e0._0_4_ = uVar1;
  local_16e0._8_4_ = uVar1;
  local_16e0._12_4_ = uVar1;
  local_16e0._16_4_ = uVar1;
  local_16e0._20_4_ = uVar1;
  local_16e0._24_4_ = uVar1;
  local_16e0._28_4_ = uVar1;
  auVar134 = ZEXT3264(local_16e0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1700._4_4_ = uVar1;
  local_1700._0_4_ = uVar1;
  local_1700._8_4_ = uVar1;
  local_1700._12_4_ = uVar1;
  local_1700._16_4_ = uVar1;
  local_1700._20_4_ = uVar1;
  local_1700._24_4_ = uVar1;
  local_1700._28_4_ = uVar1;
  auVar138 = ZEXT3264(local_1700);
  fVar135 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar140 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar141 = fVar135 * 0.99999964;
  fVar142 = fVar139 * 0.99999964;
  fVar143 = fVar140 * 0.99999964;
  fVar135 = fVar135 * 1.0000004;
  fVar139 = fVar139 * 1.0000004;
  fVar140 = fVar140 * 1.0000004;
  uVar84 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1848 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar85 = local_1848 ^ 0x20;
  iVar68 = (tray->tnear).field_0.i[k];
  local_1680._4_4_ = iVar68;
  local_1680._0_4_ = iVar68;
  local_1680._8_4_ = iVar68;
  local_1680._12_4_ = iVar68;
  local_1680._16_4_ = iVar68;
  local_1680._20_4_ = iVar68;
  local_1680._24_4_ = iVar68;
  local_1680._28_4_ = iVar68;
  auVar119 = ZEXT3264(local_1680);
  iVar68 = (tray->tfar).field_0.i[k];
  local_16a0._4_4_ = iVar68;
  local_16a0._0_4_ = iVar68;
  local_16a0._8_4_ = iVar68;
  local_16a0._12_4_ = iVar68;
  local_16a0._16_4_ = iVar68;
  local_16a0._20_4_ = iVar68;
  local_16a0._24_4_ = iVar68;
  local_16a0._28_4_ = iVar68;
  auVar128 = ZEXT3264(local_16a0);
  local_1420._16_16_ = mm_lookupmask_ps._240_16_;
  local_1420._0_16_ = mm_lookupmask_ps._0_16_;
  local_1880 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar89._8_4_ = 0xbf800000;
  auVar89._0_8_ = 0xbf800000bf800000;
  auVar89._12_4_ = 0xbf800000;
  auVar89._16_4_ = 0xbf800000;
  auVar89._20_4_ = 0xbf800000;
  auVar89._24_4_ = 0xbf800000;
  auVar89._28_4_ = 0xbf800000;
  _local_1440 = vblendvps_avx(auVar101,auVar89,local_1420);
  local_1928 = local_11f8;
  fVar144 = fVar141;
  fVar148 = fVar141;
  fVar149 = fVar141;
  fVar150 = fVar141;
  fVar151 = fVar141;
  fVar152 = fVar141;
  fVar155 = fVar142;
  fVar156 = fVar142;
  fVar157 = fVar142;
  fVar158 = fVar142;
  fVar159 = fVar142;
  fVar160 = fVar142;
  fVar161 = fVar143;
  fVar162 = fVar143;
  fVar163 = fVar143;
  fVar164 = fVar143;
  fVar165 = fVar143;
  fVar166 = fVar143;
  fVar168 = fVar135;
  fVar169 = fVar135;
  fVar170 = fVar135;
  fVar171 = fVar135;
  fVar172 = fVar135;
  fVar173 = fVar135;
  fVar177 = fVar139;
  fVar178 = fVar139;
  fVar179 = fVar139;
  fVar180 = fVar139;
  fVar181 = fVar139;
  fVar182 = fVar139;
  fVar185 = fVar140;
  fVar186 = fVar140;
  fVar187 = fVar140;
  fVar188 = fVar140;
  fVar189 = fVar140;
  fVar190 = fVar140;
  local_17c0 = fVar140;
  fStack_17bc = fVar140;
  fStack_17b8 = fVar140;
  fStack_17b4 = fVar140;
  fStack_17b0 = fVar140;
  fStack_17ac = fVar140;
  fStack_17a8 = fVar140;
  fStack_17a4 = fVar140;
  local_17a0 = fVar139;
  fStack_179c = fVar139;
  fStack_1798 = fVar139;
  fStack_1794 = fVar139;
  fStack_1790 = fVar139;
  fStack_178c = fVar139;
  fStack_1788 = fVar139;
  fStack_1784 = fVar139;
  local_1780 = fVar135;
  fStack_177c = fVar135;
  fStack_1778 = fVar135;
  fStack_1774 = fVar135;
  fStack_1770 = fVar135;
  fStack_176c = fVar135;
  fStack_1768 = fVar135;
  fStack_1764 = fVar135;
  local_1760 = fVar143;
  fStack_175c = fVar143;
  fStack_1758 = fVar143;
  fStack_1754 = fVar143;
  fStack_1750 = fVar143;
  fStack_174c = fVar143;
  fStack_1748 = fVar143;
  fStack_1744 = fVar143;
  local_1740 = fVar142;
  fStack_173c = fVar142;
  fStack_1738 = fVar142;
  fStack_1734 = fVar142;
  fStack_1730 = fVar142;
  fStack_172c = fVar142;
  fStack_1728 = fVar142;
  fStack_1724 = fVar142;
  local_1720 = fVar141;
  fStack_171c = fVar141;
  fStack_1718 = fVar141;
  fStack_1714 = fVar141;
  fStack_1710 = fVar141;
  fStack_170c = fVar141;
  fStack_1708 = fVar141;
  fStack_1704 = fVar141;
LAB_01682cd5:
  do {
    puVar72 = local_1928;
    if (puVar72 == &local_1200) {
LAB_01683d15:
      return puVar72 != &local_1200;
    }
    local_1928 = puVar72 + -1;
    uVar86 = puVar72[-1];
    while ((uVar86 & 8) == 0) {
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar90._4_4_ = uVar1;
      auVar90._0_4_ = uVar1;
      auVar90._8_4_ = uVar1;
      auVar90._12_4_ = uVar1;
      auVar90._16_4_ = uVar1;
      auVar90._20_4_ = uVar1;
      auVar90._24_4_ = uVar1;
      auVar90._28_4_ = uVar1;
      uVar64 = uVar86 & 0xfffffffffffffff0;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + uVar84),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + uVar84));
      auVar89 = vsubps_avx(ZEXT1632(auVar42),auVar131._0_32_);
      auVar98._4_4_ = fVar144 * auVar89._4_4_;
      auVar98._0_4_ = fVar141 * auVar89._0_4_;
      auVar98._8_4_ = fVar148 * auVar89._8_4_;
      auVar98._12_4_ = fVar149 * auVar89._12_4_;
      auVar98._16_4_ = fVar150 * auVar89._16_4_;
      auVar98._20_4_ = fVar151 * auVar89._20_4_;
      auVar98._24_4_ = fVar152 * auVar89._24_4_;
      auVar98._28_4_ = auVar89._28_4_;
      auVar89 = vmaxps_avx(auVar119._0_32_,auVar98);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + local_1848),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + local_1848));
      auVar101 = vsubps_avx(ZEXT1632(auVar42),auVar134._0_32_);
      auVar33._4_4_ = fVar155 * auVar101._4_4_;
      auVar33._0_4_ = fVar142 * auVar101._0_4_;
      auVar33._8_4_ = fVar156 * auVar101._8_4_;
      auVar33._12_4_ = fVar157 * auVar101._12_4_;
      auVar33._16_4_ = fVar158 * auVar101._16_4_;
      auVar33._20_4_ = fVar159 * auVar101._20_4_;
      auVar33._24_4_ = fVar160 * auVar101._24_4_;
      auVar33._28_4_ = auVar101._28_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + uVar71),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + uVar71));
      auVar101 = vsubps_avx(ZEXT1632(auVar42),auVar138._0_32_);
      auVar34._4_4_ = fVar161 * auVar101._4_4_;
      auVar34._0_4_ = fVar143 * auVar101._0_4_;
      auVar34._8_4_ = fVar162 * auVar101._8_4_;
      auVar34._12_4_ = fVar163 * auVar101._12_4_;
      auVar34._16_4_ = fVar164 * auVar101._16_4_;
      auVar34._20_4_ = fVar165 * auVar101._20_4_;
      auVar34._24_4_ = fVar166 * auVar101._24_4_;
      auVar34._28_4_ = auVar101._28_4_;
      auVar101 = vmaxps_avx(auVar33,auVar34);
      auVar89 = vmaxps_avx(auVar89,auVar101);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + (uVar84 ^ 0x20)),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + (uVar84 ^ 0x20)));
      auVar101 = vsubps_avx(ZEXT1632(auVar42),auVar131._0_32_);
      auVar35._4_4_ = fVar168 * auVar101._4_4_;
      auVar35._0_4_ = fVar135 * auVar101._0_4_;
      auVar35._8_4_ = fVar169 * auVar101._8_4_;
      auVar35._12_4_ = fVar170 * auVar101._12_4_;
      auVar35._16_4_ = fVar171 * auVar101._16_4_;
      auVar35._20_4_ = fVar172 * auVar101._20_4_;
      auVar35._24_4_ = fVar173 * auVar101._24_4_;
      auVar35._28_4_ = auVar101._28_4_;
      auVar101 = vminps_avx(auVar128._0_32_,auVar35);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + uVar85),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + uVar85));
      auVar98 = vsubps_avx(ZEXT1632(auVar42),auVar134._0_32_);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar64 + 0x100 + (uVar71 ^ 0x20)),auVar90,
                                *(undefined1 (*) [32])(uVar64 + 0x40 + (uVar71 ^ 0x20)));
      auVar36._4_4_ = fVar177 * auVar98._4_4_;
      auVar36._0_4_ = fVar139 * auVar98._0_4_;
      auVar36._8_4_ = fVar178 * auVar98._8_4_;
      auVar36._12_4_ = fVar179 * auVar98._12_4_;
      auVar36._16_4_ = fVar180 * auVar98._16_4_;
      auVar36._20_4_ = fVar181 * auVar98._20_4_;
      auVar36._24_4_ = fVar182 * auVar98._24_4_;
      auVar36._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(ZEXT1632(auVar42),auVar138._0_32_);
      auVar37._4_4_ = fVar185 * auVar98._4_4_;
      auVar37._0_4_ = fVar140 * auVar98._0_4_;
      auVar37._8_4_ = fVar186 * auVar98._8_4_;
      auVar37._12_4_ = fVar187 * auVar98._12_4_;
      auVar37._16_4_ = fVar188 * auVar98._16_4_;
      auVar37._20_4_ = fVar189 * auVar98._20_4_;
      auVar37._24_4_ = fVar190 * auVar98._24_4_;
      auVar37._28_4_ = auVar98._28_4_;
      auVar98 = vminps_avx(auVar36,auVar37);
      auVar101 = vminps_avx(auVar101,auVar98);
      auVar89 = vcmpps_avx(auVar89,auVar101,2);
      if (((uint)uVar86 & 7) == 6) {
        auVar101 = vcmpps_avx(*(undefined1 (*) [32])(uVar64 + 0x1c0),auVar90,2);
        auVar98 = vcmpps_avx(auVar90,*(undefined1 (*) [32])(uVar64 + 0x1e0),1);
        auVar101 = vandps_avx(auVar101,auVar98);
        auVar89 = vandps_avx(auVar101,auVar89);
        auVar42 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
      }
      else {
        auVar42 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
      }
      auVar87 = vpsllw_avx(auVar42,0xf);
      auVar42 = vpacksswb_avx(auVar87,auVar87);
      bVar66 = SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar42 >> 0x17,0) & 1) << 2 | (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar42 >> 0x27,0) & 1) << 4 | (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar42 >> 0x37,0) & 1) << 6 | SUB161(auVar42 >> 0x3f,0) << 7;
      if ((((((((auVar87 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar87 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar87 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar87 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar87[0xf])
      goto LAB_01682cd5;
      lVar41 = 0;
      for (uVar86 = (ulong)bVar66; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar86 = *(ulong *)(uVar64 + lVar41 * 8);
      uVar67 = bVar66 - 1 & (uint)bVar66;
      uVar69 = (ulong)uVar67;
      if (uVar67 != 0) {
        do {
          *local_1928 = uVar86;
          local_1928 = local_1928 + 1;
          lVar41 = 0;
          for (uVar86 = uVar69; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          uVar69 = uVar69 - 1 & uVar69;
          uVar86 = *(ulong *)(uVar64 + lVar41 * 8);
        } while (uVar69 != 0);
      }
    }
    local_1870 = (ulong)((uint)uVar86 & 0xf) - 8;
    uVar86 = uVar86 & 0xfffffffffffffff0;
    for (local_1878 = 0; local_1878 != local_1870; local_1878 = local_1878 + 1) {
      lVar65 = local_1878 * 0x60;
      pSVar6 = context->scene;
      pRVar7 = (pSVar6->geometries).items;
      pGVar8 = pRVar7[*(uint *)(uVar86 + 0x40 + lVar65)].ptr;
      fVar135 = (pGVar8->time_range).lower;
      fVar135 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar135) / ((pGVar8->time_range).upper - fVar135)
                );
      auVar42 = vroundss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),9);
      auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
      auVar115 = vmaxss_avx(ZEXT816(0) << 0x20,auVar42);
      iVar68 = (int)auVar115._0_4_;
      lVar79 = (long)iVar68 * 0x38;
      lVar41 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar79);
      uVar81 = (ulong)*(uint *)(uVar86 + 4 + lVar65);
      auVar42 = *(undefined1 (*) [16])(lVar41 + (ulong)*(uint *)(uVar86 + lVar65) * 4);
      uVar73 = (ulong)*(uint *)(uVar86 + 0x10 + lVar65);
      auVar87 = *(undefined1 (*) [16])(lVar41 + uVar73 * 4);
      uVar74 = (ulong)*(uint *)(uVar86 + 0x20 + lVar65);
      auVar100 = *(undefined1 (*) [16])(lVar41 + uVar74 * 4);
      uVar75 = (ulong)*(uint *)(uVar86 + 0x30 + lVar65);
      auVar2 = *(undefined1 (*) [16])(lVar41 + uVar75 * 4);
      local_1858 = *(long *)&pRVar7[*(uint *)(uVar86 + 0x44 + lVar65)].ptr[2].numPrimitives;
      lVar41 = *(long *)(local_1858 + lVar79);
      auVar109 = *(undefined1 (*) [16])(lVar41 + uVar81 * 4);
      uVar76 = (ulong)*(uint *)(uVar86 + 0x14 + lVar65);
      auVar99 = *(undefined1 (*) [16])(lVar41 + uVar76 * 4);
      uVar77 = (ulong)*(uint *)(uVar86 + 0x24 + lVar65);
      auVar3 = *(undefined1 (*) [16])(lVar41 + uVar77 * 4);
      uVar78 = (ulong)*(uint *)(uVar86 + 0x34 + lVar65);
      auVar88 = *(undefined1 (*) [16])(lVar41 + uVar78 * 4);
      lVar41 = *(long *)&pRVar7[*(uint *)(uVar86 + 0x48 + lVar65)].ptr[2].numPrimitives;
      lVar9 = *(long *)(lVar41 + lVar79);
      uVar69 = (ulong)*(uint *)(uVar86 + 8 + lVar65);
      auVar104 = *(undefined1 (*) [16])(lVar9 + uVar69 * 4);
      local_1850 = (ulong)*(uint *)(uVar86 + 0x18 + lVar65);
      auVar183 = *(undefined1 (*) [16])(lVar9 + local_1850 * 4);
      uVar82 = (ulong)*(uint *)(uVar86 + 0x28 + lVar65);
      auVar4 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
      uVar83 = (ulong)*(uint *)(uVar86 + 0x38 + lVar65);
      auVar5 = *(undefined1 (*) [16])(lVar9 + uVar83 * 4);
      fVar135 = fVar135 - auVar115._0_4_;
      lVar9 = *(long *)&pRVar7[*(uint *)(uVar86 + 0x4c + lVar65)].ptr[2].numPrimitives;
      lVar79 = *(long *)(lVar9 + lVar79);
      uVar64 = (ulong)*(uint *)(uVar86 + 0xc + lVar65);
      auVar115 = *(undefined1 (*) [16])(lVar79 + uVar64 * 4);
      local_1868 = (ulong)*(uint *)(uVar86 + 0x1c + lVar65);
      auVar129 = *(undefined1 (*) [16])(lVar79 + local_1868 * 4);
      auVar132 = vunpcklps_avx(auVar42,auVar104);
      auVar104 = vunpckhps_avx(auVar42,auVar104);
      auVar136 = vunpcklps_avx(auVar109,auVar115);
      auVar109 = vunpckhps_avx(auVar109,auVar115);
      uVar80 = (ulong)*(uint *)(uVar86 + 0x2c + lVar65);
      auVar42 = *(undefined1 (*) [16])(lVar79 + uVar80 * 4);
      auVar115 = vunpcklps_avx(auVar104,auVar109);
      local_14e0 = vunpcklps_avx(auVar132,auVar136);
      auVar109 = vunpckhps_avx(auVar132,auVar136);
      auVar132 = vunpcklps_avx(auVar87,auVar183);
      auVar104 = vunpckhps_avx(auVar87,auVar183);
      auVar183 = vunpcklps_avx(auVar99,auVar129);
      auVar99 = vunpckhps_avx(auVar99,auVar129);
      local_1860 = (ulong)*(uint *)(uVar86 + 0x3c + lVar65);
      auVar87 = *(undefined1 (*) [16])(lVar79 + local_1860 * 4);
      auVar104 = vunpcklps_avx(auVar104,auVar99);
      auVar129 = vunpcklps_avx(auVar132,auVar183);
      auVar99 = vunpckhps_avx(auVar132,auVar183);
      auVar183 = vunpcklps_avx(auVar100,auVar4);
      auVar100 = vunpckhps_avx(auVar100,auVar4);
      auVar4 = vunpcklps_avx(auVar3,auVar42);
      auVar3 = vunpckhps_avx(auVar3,auVar42);
      lVar70 = (long)(iVar68 + 1) * 0x38;
      lVar79 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar70);
      auVar42 = *(undefined1 (*) [16])(lVar79 + (ulong)*(uint *)(uVar86 + lVar65) * 4);
      auVar132 = vunpcklps_avx(auVar100,auVar3);
      auVar136 = vunpcklps_avx(auVar183,auVar4);
      local_1510 = vunpckhps_avx(auVar183,auVar4);
      auVar3 = vunpcklps_avx(auVar2,auVar5);
      auVar100 = vunpckhps_avx(auVar2,auVar5);
      auVar183 = vunpcklps_avx(auVar88,auVar87);
      auVar2 = vunpckhps_avx(auVar88,auVar87);
      lVar41 = *(long *)(lVar41 + lVar70);
      auVar87 = *(undefined1 (*) [16])(lVar41 + uVar69 * 4);
      auVar4 = vunpcklps_avx(auVar100,auVar2);
      local_14f0 = vunpcklps_avx(auVar3,auVar183);
      local_1500 = vunpckhps_avx(auVar3,auVar183);
      lVar10 = *(long *)(local_1858 + lVar70);
      auVar2 = vunpcklps_avx(auVar42,auVar87);
      auVar100 = vunpckhps_avx(auVar42,auVar87);
      auVar42 = *(undefined1 (*) [16])(lVar10 + uVar81 * 4);
      lVar9 = *(long *)(lVar9 + lVar70);
      auVar87 = *(undefined1 (*) [16])(lVar9 + uVar64 * 4);
      auVar3 = vunpcklps_avx(auVar42,auVar87);
      auVar42 = vunpckhps_avx(auVar42,auVar87);
      auVar183 = vunpcklps_avx(auVar100,auVar42);
      auVar5 = vunpcklps_avx(auVar2,auVar3);
      auVar100 = vunpckhps_avx(auVar2,auVar3);
      auVar42 = *(undefined1 (*) [16])(lVar79 + uVar73 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar41 + local_1850 * 4);
      auVar3 = vunpcklps_avx(auVar42,auVar87);
      auVar2 = vunpckhps_avx(auVar42,auVar87);
      auVar42 = *(undefined1 (*) [16])(lVar10 + uVar76 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar9 + local_1868 * 4);
      auVar88 = vunpcklps_avx(auVar42,auVar87);
      auVar42 = vunpckhps_avx(auVar42,auVar87);
      auVar145 = vunpcklps_avx(auVar2,auVar42);
      auVar38 = vunpcklps_avx(auVar3,auVar88);
      auVar2 = vunpckhps_avx(auVar3,auVar88);
      auVar42 = *(undefined1 (*) [16])(lVar79 + uVar74 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar41 + uVar82 * 4);
      auVar88 = vunpcklps_avx(auVar42,auVar87);
      auVar3 = vunpckhps_avx(auVar42,auVar87);
      auVar42 = *(undefined1 (*) [16])(lVar10 + uVar77 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar9 + uVar80 * 4);
      auVar93 = vunpcklps_avx(auVar42,auVar87);
      auVar42 = vunpckhps_avx(auVar42,auVar87);
      auVar39 = vunpcklps_avx(auVar3,auVar42);
      auVar40 = vunpcklps_avx(auVar88,auVar93);
      auVar3 = vunpckhps_avx(auVar88,auVar93);
      auVar42 = *(undefined1 (*) [16])(lVar79 + uVar75 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar41 + uVar83 * 4);
      auVar93 = vunpcklps_avx(auVar42,auVar87);
      auVar88 = vunpckhps_avx(auVar42,auVar87);
      auVar42 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
      auVar87 = *(undefined1 (*) [16])(lVar9 + local_1860 * 4);
      auVar126 = vunpcklps_avx(auVar42,auVar87);
      auVar42 = vunpckhps_avx(auVar42,auVar87);
      auVar87 = vunpcklps_avx(auVar88,auVar42);
      auVar88 = vunpcklps_avx(auVar93,auVar126);
      auVar42 = vunpckhps_avx(auVar93,auVar126);
      fVar139 = 1.0 - fVar135;
      auVar174._4_4_ = fVar139;
      auVar174._0_4_ = fVar139;
      auVar174._8_4_ = fVar139;
      auVar174._12_4_ = fVar139;
      auVar93._0_4_ = fVar135 * auVar5._0_4_;
      auVar93._4_4_ = fVar135 * auVar5._4_4_;
      auVar93._8_4_ = fVar135 * auVar5._8_4_;
      auVar93._12_4_ = fVar135 * auVar5._12_4_;
      auVar5 = vfmadd231ps_fma(auVar93,auVar174,local_14e0);
      auVar126._0_4_ = fVar135 * auVar100._0_4_;
      auVar126._4_4_ = fVar135 * auVar100._4_4_;
      auVar126._8_4_ = fVar135 * auVar100._8_4_;
      auVar126._12_4_ = fVar135 * auVar100._12_4_;
      auVar100 = vfmadd231ps_fma(auVar126,auVar174,auVar109);
      auVar109._0_4_ = auVar183._0_4_ * fVar135;
      auVar109._4_4_ = auVar183._4_4_ * fVar135;
      auVar109._8_4_ = auVar183._8_4_ * fVar135;
      auVar109._12_4_ = auVar183._12_4_ * fVar135;
      auVar109 = vfmadd231ps_fma(auVar109,auVar174,auVar115);
      auVar183._0_4_ = fVar135 * auVar38._0_4_;
      auVar183._4_4_ = fVar135 * auVar38._4_4_;
      auVar183._8_4_ = fVar135 * auVar38._8_4_;
      auVar183._12_4_ = fVar135 * auVar38._12_4_;
      auVar183 = vfmadd231ps_fma(auVar183,auVar174,auVar129);
      auVar115._0_4_ = fVar135 * auVar2._0_4_;
      auVar115._4_4_ = fVar135 * auVar2._4_4_;
      auVar115._8_4_ = fVar135 * auVar2._8_4_;
      auVar115._12_4_ = fVar135 * auVar2._12_4_;
      auVar2 = vfmadd231ps_fma(auVar115,auVar174,auVar99);
      auVar99._0_4_ = auVar145._0_4_ * fVar135;
      auVar99._4_4_ = auVar145._4_4_ * fVar135;
      auVar99._8_4_ = auVar145._8_4_ * fVar135;
      auVar99._12_4_ = auVar145._12_4_ * fVar135;
      auVar99 = vfmadd231ps_fma(auVar99,auVar174,auVar104);
      auVar104._0_4_ = fVar135 * auVar40._0_4_;
      auVar104._4_4_ = fVar135 * auVar40._4_4_;
      auVar104._8_4_ = fVar135 * auVar40._8_4_;
      auVar104._12_4_ = fVar135 * auVar40._12_4_;
      auVar104 = vfmadd231ps_fma(auVar104,auVar174,auVar136);
      auVar136._0_4_ = auVar3._0_4_ * fVar135;
      auVar136._4_4_ = auVar3._4_4_ * fVar135;
      auVar136._8_4_ = auVar3._8_4_ * fVar135;
      auVar136._12_4_ = auVar3._12_4_ * fVar135;
      auVar3 = vfmadd231ps_fma(auVar136,auVar174,local_1510);
      auVar145._0_4_ = auVar39._0_4_ * fVar135;
      auVar145._4_4_ = auVar39._4_4_ * fVar135;
      auVar145._8_4_ = auVar39._8_4_ * fVar135;
      auVar145._12_4_ = auVar39._12_4_ * fVar135;
      auVar115 = vfmadd231ps_fma(auVar145,auVar174,auVar132);
      auVar129._0_4_ = fVar135 * auVar88._0_4_;
      auVar129._4_4_ = fVar135 * auVar88._4_4_;
      auVar129._8_4_ = fVar135 * auVar88._8_4_;
      auVar129._12_4_ = fVar135 * auVar88._12_4_;
      auVar132._0_4_ = auVar42._0_4_ * fVar135;
      auVar132._4_4_ = auVar42._4_4_ * fVar135;
      auVar132._8_4_ = auVar42._8_4_ * fVar135;
      auVar132._12_4_ = auVar42._12_4_ * fVar135;
      lVar41 = uVar86 + 0x40 + lVar65;
      local_13e0 = *(undefined8 *)(lVar41 + 0x10);
      uStack_13d8 = *(undefined8 *)(lVar41 + 0x18);
      auVar88._0_4_ = auVar87._0_4_ * fVar135;
      auVar88._4_4_ = auVar87._4_4_ * fVar135;
      auVar88._8_4_ = auVar87._8_4_ * fVar135;
      auVar88._12_4_ = auVar87._12_4_ * fVar135;
      uStack_13d0 = local_13e0;
      uStack_13c8 = uStack_13d8;
      lVar65 = uVar86 + 0x50 + lVar65;
      local_1400 = *(undefined8 *)(lVar65 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar65 + 0x18);
      auVar42 = vfmadd231ps_fma(auVar129,auVar174,local_14f0);
      auVar87 = vfmadd231ps_fma(auVar132,auVar174,local_1500);
      auVar88 = vfmadd231ps_fma(auVar88,auVar174,auVar4);
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      auVar94._16_16_ = auVar104;
      auVar94._0_16_ = auVar5;
      auVar105._16_16_ = auVar3;
      auVar105._0_16_ = auVar100;
      auVar110._16_16_ = auVar115;
      auVar110._0_16_ = auVar109;
      auVar127._16_16_ = auVar183;
      auVar127._0_16_ = auVar183;
      auVar116._16_16_ = auVar2;
      auVar116._0_16_ = auVar2;
      auVar102._16_16_ = auVar99;
      auVar102._0_16_ = auVar99;
      auVar184._16_16_ = auVar42;
      auVar184._0_16_ = auVar42;
      auVar175._16_16_ = auVar87;
      auVar175._0_16_ = auVar87;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar146._4_4_ = uVar1;
      auVar146._0_4_ = uVar1;
      auVar146._8_4_ = uVar1;
      auVar146._12_4_ = uVar1;
      auVar146._16_4_ = uVar1;
      auVar146._20_4_ = uVar1;
      auVar146._24_4_ = uVar1;
      auVar146._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar153._4_4_ = uVar1;
      auVar153._0_4_ = uVar1;
      auVar153._8_4_ = uVar1;
      auVar153._12_4_ = uVar1;
      auVar153._16_4_ = uVar1;
      auVar153._20_4_ = uVar1;
      auVar153._24_4_ = uVar1;
      auVar153._28_4_ = uVar1;
      auVar91._16_16_ = auVar88;
      auVar91._0_16_ = auVar88;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar167._4_4_ = uVar1;
      auVar167._0_4_ = uVar1;
      auVar167._8_4_ = uVar1;
      auVar167._12_4_ = uVar1;
      auVar167._16_4_ = uVar1;
      auVar167._20_4_ = uVar1;
      auVar167._24_4_ = uVar1;
      auVar167._28_4_ = uVar1;
      local_1820 = vsubps_avx(auVar94,auVar146);
      auVar33 = vsubps_avx(auVar105,auVar153);
      local_1540 = vsubps_avx(auVar110,auVar167);
      auVar89 = vsubps_avx(auVar127,auVar146);
      auVar101 = vsubps_avx(auVar116,auVar153);
      auVar98 = vsubps_avx(auVar102,auVar167);
      auVar34 = vsubps_avx(auVar184,auVar146);
      auVar35 = vsubps_avx(auVar175,auVar153);
      auVar36 = vsubps_avx(auVar91,auVar167);
      local_1560 = vsubps_avx(auVar34,local_1820);
      local_15a0 = vsubps_avx(auVar35,auVar33);
      local_1580 = vsubps_avx(auVar36,local_1540);
      auVar92._0_4_ = local_1820._0_4_ + auVar34._0_4_;
      auVar92._4_4_ = local_1820._4_4_ + auVar34._4_4_;
      auVar92._8_4_ = local_1820._8_4_ + auVar34._8_4_;
      auVar92._12_4_ = local_1820._12_4_ + auVar34._12_4_;
      auVar92._16_4_ = local_1820._16_4_ + auVar34._16_4_;
      auVar92._20_4_ = local_1820._20_4_ + auVar34._20_4_;
      auVar92._24_4_ = local_1820._24_4_ + auVar34._24_4_;
      auVar92._28_4_ = local_1820._28_4_ + auVar34._28_4_;
      auVar103._0_4_ = auVar35._0_4_ + auVar33._0_4_;
      auVar103._4_4_ = auVar35._4_4_ + auVar33._4_4_;
      auVar103._8_4_ = auVar35._8_4_ + auVar33._8_4_;
      auVar103._12_4_ = auVar35._12_4_ + auVar33._12_4_;
      auVar103._16_4_ = auVar35._16_4_ + auVar33._16_4_;
      auVar103._20_4_ = auVar35._20_4_ + auVar33._20_4_;
      auVar103._24_4_ = auVar35._24_4_ + auVar33._24_4_;
      fVar135 = auVar33._28_4_;
      auVar103._28_4_ = auVar35._28_4_ + fVar135;
      fVar12 = local_1540._0_4_;
      auVar111._0_4_ = auVar36._0_4_ + fVar12;
      fVar13 = local_1540._4_4_;
      auVar111._4_4_ = auVar36._4_4_ + fVar13;
      fVar14 = local_1540._8_4_;
      auVar111._8_4_ = auVar36._8_4_ + fVar14;
      fVar15 = local_1540._12_4_;
      auVar111._12_4_ = auVar36._12_4_ + fVar15;
      fVar16 = local_1540._16_4_;
      auVar111._16_4_ = auVar36._16_4_ + fVar16;
      fVar17 = local_1540._20_4_;
      auVar111._20_4_ = auVar36._20_4_ + fVar17;
      fVar18 = local_1540._24_4_;
      fVar139 = auVar36._28_4_;
      auVar111._24_4_ = auVar36._24_4_ + fVar18;
      auVar111._28_4_ = fVar139 + local_1540._28_4_;
      auVar43._4_4_ = local_1580._4_4_ * auVar103._4_4_;
      auVar43._0_4_ = local_1580._0_4_ * auVar103._0_4_;
      auVar43._8_4_ = local_1580._8_4_ * auVar103._8_4_;
      auVar43._12_4_ = local_1580._12_4_ * auVar103._12_4_;
      auVar43._16_4_ = local_1580._16_4_ * auVar103._16_4_;
      auVar43._20_4_ = local_1580._20_4_ * auVar103._20_4_;
      auVar43._24_4_ = local_1580._24_4_ * auVar103._24_4_;
      auVar43._28_4_ = uVar1;
      auVar87 = vfmsub231ps_fma(auVar43,local_15a0,auVar111);
      auVar44._4_4_ = local_1560._4_4_ * auVar111._4_4_;
      auVar44._0_4_ = local_1560._0_4_ * auVar111._0_4_;
      auVar44._8_4_ = local_1560._8_4_ * auVar111._8_4_;
      auVar44._12_4_ = local_1560._12_4_ * auVar111._12_4_;
      auVar44._16_4_ = local_1560._16_4_ * auVar111._16_4_;
      auVar44._20_4_ = local_1560._20_4_ * auVar111._20_4_;
      auVar44._24_4_ = local_1560._24_4_ * auVar111._24_4_;
      auVar44._28_4_ = auVar111._28_4_;
      auVar42 = vfmsub231ps_fma(auVar44,local_1580,auVar92);
      auVar45._4_4_ = local_15a0._4_4_ * auVar92._4_4_;
      auVar45._0_4_ = local_15a0._0_4_ * auVar92._0_4_;
      auVar45._8_4_ = local_15a0._8_4_ * auVar92._8_4_;
      auVar45._12_4_ = local_15a0._12_4_ * auVar92._12_4_;
      auVar45._16_4_ = local_15a0._16_4_ * auVar92._16_4_;
      auVar45._20_4_ = local_15a0._20_4_ * auVar92._20_4_;
      auVar45._24_4_ = local_15a0._24_4_ * auVar92._24_4_;
      auVar45._28_4_ = auVar92._28_4_;
      auVar100 = vfmsub231ps_fma(auVar45,local_1560,auVar103);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar154._4_4_ = uVar1;
      auVar154._0_4_ = uVar1;
      auVar154._8_4_ = uVar1;
      auVar154._12_4_ = uVar1;
      auVar154._16_4_ = uVar1;
      auVar154._20_4_ = uVar1;
      auVar154._24_4_ = uVar1;
      auVar154._28_4_ = uVar1;
      fStack_15b0 = *(float *)(ray + k * 4 + 0x60);
      auVar46._4_4_ = fStack_15b0 * auVar100._4_4_;
      auVar46._0_4_ = fStack_15b0 * auVar100._0_4_;
      auVar46._8_4_ = fStack_15b0 * auVar100._8_4_;
      auVar46._12_4_ = fStack_15b0 * auVar100._12_4_;
      auVar46._16_4_ = fStack_15b0 * 0.0;
      auVar46._20_4_ = fStack_15b0 * 0.0;
      auVar46._24_4_ = fStack_15b0 * 0.0;
      auVar46._28_4_ = auVar103._28_4_;
      auVar42 = vfmadd231ps_fma(auVar46,auVar154,ZEXT1632(auVar42));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar176._4_4_ = uVar1;
      auVar176._0_4_ = uVar1;
      auVar176._8_4_ = uVar1;
      auVar176._12_4_ = uVar1;
      auVar176._16_4_ = uVar1;
      auVar176._20_4_ = uVar1;
      auVar176._24_4_ = uVar1;
      auVar176._28_4_ = uVar1;
      auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar176,ZEXT1632(auVar87));
      local_15e0 = vsubps_avx(auVar33,auVar101);
      local_1620 = vsubps_avx(local_1540,auVar98);
      auVar117._0_4_ = auVar101._0_4_ + auVar33._0_4_;
      auVar117._4_4_ = auVar101._4_4_ + auVar33._4_4_;
      auVar117._8_4_ = auVar101._8_4_ + auVar33._8_4_;
      auVar117._12_4_ = auVar101._12_4_ + auVar33._12_4_;
      auVar117._16_4_ = auVar101._16_4_ + auVar33._16_4_;
      auVar117._20_4_ = auVar101._20_4_ + auVar33._20_4_;
      auVar117._24_4_ = auVar101._24_4_ + auVar33._24_4_;
      auVar117._28_4_ = auVar101._28_4_ + fVar135;
      auVar112._0_4_ = fVar12 + auVar98._0_4_;
      auVar112._4_4_ = fVar13 + auVar98._4_4_;
      auVar112._8_4_ = fVar14 + auVar98._8_4_;
      auVar112._12_4_ = fVar15 + auVar98._12_4_;
      auVar112._16_4_ = fVar16 + auVar98._16_4_;
      auVar112._20_4_ = fVar17 + auVar98._20_4_;
      auVar112._24_4_ = fVar18 + auVar98._24_4_;
      auVar112._28_4_ = local_1540._28_4_ + auVar98._28_4_;
      fVar114 = local_1620._0_4_;
      fVar122 = local_1620._4_4_;
      auVar47._4_4_ = auVar117._4_4_ * fVar122;
      auVar47._0_4_ = auVar117._0_4_ * fVar114;
      fVar125 = local_1620._8_4_;
      auVar47._8_4_ = auVar117._8_4_ * fVar125;
      fVar21 = local_1620._12_4_;
      auVar47._12_4_ = auVar117._12_4_ * fVar21;
      fVar24 = local_1620._16_4_;
      auVar47._16_4_ = auVar117._16_4_ * fVar24;
      fVar27 = local_1620._20_4_;
      auVar47._20_4_ = auVar117._20_4_ * fVar27;
      fVar30 = local_1620._24_4_;
      auVar47._24_4_ = auVar117._24_4_ * fVar30;
      auVar47._28_4_ = fVar135;
      auVar100 = vfmsub231ps_fma(auVar47,local_15e0,auVar112);
      local_1600 = vsubps_avx(local_1820,auVar89);
      fVar120 = local_1600._0_4_;
      fVar123 = local_1600._4_4_;
      auVar48._4_4_ = auVar112._4_4_ * fVar123;
      auVar48._0_4_ = auVar112._0_4_ * fVar120;
      fVar19 = local_1600._8_4_;
      auVar48._8_4_ = auVar112._8_4_ * fVar19;
      fVar22 = local_1600._12_4_;
      auVar48._12_4_ = auVar112._12_4_ * fVar22;
      fVar25 = local_1600._16_4_;
      auVar48._16_4_ = auVar112._16_4_ * fVar25;
      fVar28 = local_1600._20_4_;
      auVar48._20_4_ = auVar112._20_4_ * fVar28;
      fVar31 = local_1600._24_4_;
      auVar48._24_4_ = auVar112._24_4_ * fVar31;
      auVar48._28_4_ = auVar112._28_4_;
      auVar137._0_4_ = local_1820._0_4_ + auVar89._0_4_;
      auVar137._4_4_ = local_1820._4_4_ + auVar89._4_4_;
      auVar137._8_4_ = local_1820._8_4_ + auVar89._8_4_;
      auVar137._12_4_ = local_1820._12_4_ + auVar89._12_4_;
      auVar137._16_4_ = local_1820._16_4_ + auVar89._16_4_;
      auVar137._20_4_ = local_1820._20_4_ + auVar89._20_4_;
      auVar137._24_4_ = local_1820._24_4_ + auVar89._24_4_;
      auVar137._28_4_ = local_1820._28_4_ + auVar89._28_4_;
      auVar87 = vfmsub231ps_fma(auVar48,local_1620,auVar137);
      fVar121 = local_15e0._0_4_;
      fVar124 = local_15e0._4_4_;
      auVar49._4_4_ = auVar137._4_4_ * fVar124;
      auVar49._0_4_ = auVar137._0_4_ * fVar121;
      fVar20 = local_15e0._8_4_;
      auVar49._8_4_ = auVar137._8_4_ * fVar20;
      fVar23 = local_15e0._12_4_;
      auVar49._12_4_ = auVar137._12_4_ * fVar23;
      fVar26 = local_15e0._16_4_;
      auVar49._16_4_ = auVar137._16_4_ * fVar26;
      fVar29 = local_15e0._20_4_;
      auVar49._20_4_ = auVar137._20_4_ * fVar29;
      fVar32 = local_15e0._24_4_;
      auVar49._24_4_ = auVar137._24_4_ * fVar32;
      auVar49._28_4_ = auVar137._28_4_;
      auVar2 = vfmsub231ps_fma(auVar49,local_1600,auVar117);
      auVar50._4_4_ = auVar2._4_4_ * fStack_15b0;
      auVar50._0_4_ = auVar2._0_4_ * fStack_15b0;
      auVar50._8_4_ = auVar2._8_4_ * fStack_15b0;
      auVar50._12_4_ = auVar2._12_4_ * fStack_15b0;
      auVar50._16_4_ = fStack_15b0 * 0.0;
      auVar50._20_4_ = fStack_15b0 * 0.0;
      auVar50._24_4_ = fStack_15b0 * 0.0;
      auVar50._28_4_ = local_1620._28_4_;
      auVar87 = vfmadd231ps_fma(auVar50,auVar154,ZEXT1632(auVar87));
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar176,ZEXT1632(auVar100));
      auVar37 = vsubps_avx(auVar89,auVar34);
      auVar106._0_4_ = auVar89._0_4_ + auVar34._0_4_;
      auVar106._4_4_ = auVar89._4_4_ + auVar34._4_4_;
      auVar106._8_4_ = auVar89._8_4_ + auVar34._8_4_;
      auVar106._12_4_ = auVar89._12_4_ + auVar34._12_4_;
      auVar106._16_4_ = auVar89._16_4_ + auVar34._16_4_;
      auVar106._20_4_ = auVar89._20_4_ + auVar34._20_4_;
      auVar106._24_4_ = auVar89._24_4_ + auVar34._24_4_;
      auVar106._28_4_ = auVar89._28_4_ + auVar34._28_4_;
      auVar34 = vsubps_avx(auVar101,auVar35);
      auVar118._0_4_ = auVar101._0_4_ + auVar35._0_4_;
      auVar118._4_4_ = auVar101._4_4_ + auVar35._4_4_;
      auVar118._8_4_ = auVar101._8_4_ + auVar35._8_4_;
      auVar118._12_4_ = auVar101._12_4_ + auVar35._12_4_;
      auVar118._16_4_ = auVar101._16_4_ + auVar35._16_4_;
      auVar118._20_4_ = auVar101._20_4_ + auVar35._20_4_;
      auVar118._24_4_ = auVar101._24_4_ + auVar35._24_4_;
      auVar118._28_4_ = auVar101._28_4_ + auVar35._28_4_;
      auVar35 = vsubps_avx(auVar98,auVar36);
      auVar95._0_4_ = auVar98._0_4_ + auVar36._0_4_;
      auVar95._4_4_ = auVar98._4_4_ + auVar36._4_4_;
      auVar95._8_4_ = auVar98._8_4_ + auVar36._8_4_;
      auVar95._12_4_ = auVar98._12_4_ + auVar36._12_4_;
      auVar95._16_4_ = auVar98._16_4_ + auVar36._16_4_;
      auVar95._20_4_ = auVar98._20_4_ + auVar36._20_4_;
      auVar95._24_4_ = auVar98._24_4_ + auVar36._24_4_;
      auVar95._28_4_ = auVar98._28_4_ + fVar139;
      auVar51._4_4_ = auVar35._4_4_ * auVar118._4_4_;
      auVar51._0_4_ = auVar35._0_4_ * auVar118._0_4_;
      auVar51._8_4_ = auVar35._8_4_ * auVar118._8_4_;
      auVar51._12_4_ = auVar35._12_4_ * auVar118._12_4_;
      auVar51._16_4_ = auVar35._16_4_ * auVar118._16_4_;
      auVar51._20_4_ = auVar35._20_4_ * auVar118._20_4_;
      auVar51._24_4_ = auVar35._24_4_ * auVar118._24_4_;
      auVar51._28_4_ = fVar139;
      auVar2 = vfmsub231ps_fma(auVar51,auVar34,auVar95);
      auVar52._4_4_ = auVar95._4_4_ * auVar37._4_4_;
      auVar52._0_4_ = auVar95._0_4_ * auVar37._0_4_;
      auVar52._8_4_ = auVar95._8_4_ * auVar37._8_4_;
      auVar52._12_4_ = auVar95._12_4_ * auVar37._12_4_;
      auVar52._16_4_ = auVar95._16_4_ * auVar37._16_4_;
      auVar52._20_4_ = auVar95._20_4_ * auVar37._20_4_;
      auVar52._24_4_ = auVar95._24_4_ * auVar37._24_4_;
      auVar52._28_4_ = auVar95._28_4_;
      auVar100 = vfmsub231ps_fma(auVar52,auVar35,auVar106);
      auVar53._4_4_ = auVar34._4_4_ * auVar106._4_4_;
      auVar53._0_4_ = auVar34._0_4_ * auVar106._0_4_;
      auVar53._8_4_ = auVar34._8_4_ * auVar106._8_4_;
      auVar53._12_4_ = auVar34._12_4_ * auVar106._12_4_;
      auVar53._16_4_ = auVar34._16_4_ * auVar106._16_4_;
      auVar53._20_4_ = auVar34._20_4_ * auVar106._20_4_;
      auVar53._24_4_ = auVar34._24_4_ * auVar106._24_4_;
      auVar53._28_4_ = auVar106._28_4_;
      auVar109 = vfmsub231ps_fma(auVar53,auVar37,auVar118);
      fStack_15bc = fStack_15b0;
      local_15c0 = fStack_15b0;
      fStack_15b8 = fStack_15b0;
      fStack_15b4 = fStack_15b0;
      auVar107._0_4_ = fStack_15b0 * auVar109._0_4_;
      auVar107._4_4_ = fStack_15b0 * auVar109._4_4_;
      auVar107._8_4_ = fStack_15b0 * auVar109._8_4_;
      auVar107._12_4_ = fStack_15b0 * auVar109._12_4_;
      auVar107._16_4_ = fStack_15b0 * 0.0;
      auVar107._20_4_ = fStack_15b0 * 0.0;
      auVar107._24_4_ = fStack_15b0 * 0.0;
      auVar107._28_4_ = 0;
      auVar100 = vfmadd231ps_fma(auVar107,auVar154,ZEXT1632(auVar100));
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar176,ZEXT1632(auVar2));
      local_13c0 = auVar42._0_4_;
      fStack_13bc = auVar42._4_4_;
      fStack_13b8 = auVar42._8_4_;
      fStack_13b4 = auVar42._12_4_;
      local_1380 = ZEXT1632(CONCAT412(auVar100._12_4_ + fStack_13b4 + auVar87._12_4_,
                                      CONCAT48(auVar100._8_4_ + fStack_13b8 + auVar87._8_4_,
                                               CONCAT44(auVar100._4_4_ + fStack_13bc + auVar87._4_4_
                                                        ,auVar100._0_4_ + local_13c0 + auVar87._0_4_
                                                       ))));
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar96._16_4_ = 0x7fffffff;
      auVar96._20_4_ = 0x7fffffff;
      auVar96._24_4_ = 0x7fffffff;
      auVar96._28_4_ = 0x7fffffff;
      local_1640 = ZEXT1632(auVar42);
      auVar89 = vminps_avx(local_1640,ZEXT1632(auVar87));
      auVar89 = vminps_avx(auVar89,ZEXT1632(auVar100));
      local_1660 = vandps_avx(local_1380,auVar96);
      fVar135 = local_1660._0_4_ * 1.1920929e-07;
      fVar139 = local_1660._4_4_ * 1.1920929e-07;
      auVar54._4_4_ = fVar139;
      auVar54._0_4_ = fVar135;
      fVar140 = local_1660._8_4_ * 1.1920929e-07;
      auVar54._8_4_ = fVar140;
      fVar141 = local_1660._12_4_ * 1.1920929e-07;
      auVar54._12_4_ = fVar141;
      fVar142 = local_1660._16_4_ * 1.1920929e-07;
      auVar54._16_4_ = fVar142;
      fVar143 = local_1660._20_4_ * 1.1920929e-07;
      auVar54._20_4_ = fVar143;
      fVar144 = local_1660._24_4_ * 1.1920929e-07;
      auVar54._24_4_ = fVar144;
      auVar54._28_4_ = 0x34000000;
      auVar130._0_8_ = CONCAT44(fVar139,fVar135) ^ 0x8000000080000000;
      auVar130._8_4_ = -fVar140;
      auVar130._12_4_ = -fVar141;
      auVar130._16_4_ = -fVar142;
      auVar130._20_4_ = -fVar143;
      auVar130._24_4_ = -fVar144;
      auVar130._28_4_ = 0xb4000000;
      auVar89 = vcmpps_avx(auVar89,auVar130,5);
      auVar98 = vmaxps_avx(local_1640,ZEXT1632(auVar87));
      auVar101 = vmaxps_avx(auVar98,ZEXT1632(auVar100));
      auVar101 = vcmpps_avx(auVar101,auVar54,2);
      auVar101 = vorps_avx(auVar89,auVar101);
      fVar144 = fStack_171c;
      fVar148 = fStack_1718;
      fVar149 = fStack_1714;
      fVar150 = fStack_1710;
      fVar151 = fStack_170c;
      fVar152 = fStack_1708;
      fVar141 = local_1720;
      fVar155 = fStack_173c;
      fVar156 = fStack_1738;
      fVar157 = fStack_1734;
      fVar158 = fStack_1730;
      fVar159 = fStack_172c;
      fVar160 = fStack_1728;
      fVar142 = local_1740;
      fVar161 = fStack_175c;
      fVar162 = fStack_1758;
      fVar163 = fStack_1754;
      fVar164 = fStack_1750;
      fVar165 = fStack_174c;
      fVar166 = fStack_1748;
      fVar143 = local_1760;
      fVar168 = fStack_177c;
      fVar169 = fStack_1778;
      fVar170 = fStack_1774;
      fVar171 = fStack_1770;
      fVar172 = fStack_176c;
      fVar173 = fStack_1768;
      fVar135 = local_1780;
      fVar177 = fStack_179c;
      fVar178 = fStack_1798;
      fVar179 = fStack_1794;
      fVar180 = fStack_1790;
      fVar181 = fStack_178c;
      fVar182 = fStack_1788;
      fVar139 = local_17a0;
      fVar185 = fStack_17bc;
      fVar186 = fStack_17b8;
      fVar187 = fStack_17b4;
      fVar188 = fStack_17b0;
      fVar189 = fStack_17ac;
      fVar190 = fStack_17a8;
      fVar140 = local_17c0;
      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0x7f,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0xbf,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar101[0x1f]) {
LAB_01683c65:
        auVar131 = ZEXT3264(local_16c0);
        auVar134 = ZEXT3264(local_16e0);
        auVar138 = ZEXT3264(local_1700);
        auVar119 = ZEXT3264(local_1680);
        auVar128 = ZEXT3264(local_16a0);
      }
      else {
        auVar55._4_4_ = fVar124 * local_1580._4_4_;
        auVar55._0_4_ = fVar121 * local_1580._0_4_;
        auVar55._8_4_ = fVar20 * local_1580._8_4_;
        auVar55._12_4_ = fVar23 * local_1580._12_4_;
        auVar55._16_4_ = fVar26 * local_1580._16_4_;
        auVar55._20_4_ = fVar29 * local_1580._20_4_;
        auVar55._24_4_ = fVar32 * local_1580._24_4_;
        auVar55._28_4_ = auVar89._28_4_;
        auVar56._4_4_ = fVar123 * local_15a0._4_4_;
        auVar56._0_4_ = fVar120 * local_15a0._0_4_;
        auVar56._8_4_ = fVar19 * local_15a0._8_4_;
        auVar56._12_4_ = fVar22 * local_15a0._12_4_;
        auVar56._16_4_ = fVar25 * local_15a0._16_4_;
        auVar56._20_4_ = fVar28 * local_15a0._20_4_;
        auVar56._24_4_ = fVar31 * local_15a0._24_4_;
        auVar56._28_4_ = 0x34000000;
        auVar42 = vfmsub213ps_fma(local_15a0,local_1620,auVar55);
        auVar57._4_4_ = auVar34._4_4_ * fVar122;
        auVar57._0_4_ = auVar34._0_4_ * fVar114;
        auVar57._8_4_ = auVar34._8_4_ * fVar125;
        auVar57._12_4_ = auVar34._12_4_ * fVar21;
        auVar57._16_4_ = auVar34._16_4_ * fVar24;
        auVar57._20_4_ = auVar34._20_4_ * fVar27;
        auVar57._24_4_ = auVar34._24_4_ * fVar30;
        auVar57._28_4_ = auVar98._28_4_;
        auVar58._4_4_ = fVar123 * auVar35._4_4_;
        auVar58._0_4_ = fVar120 * auVar35._0_4_;
        auVar58._8_4_ = fVar19 * auVar35._8_4_;
        auVar58._12_4_ = fVar22 * auVar35._12_4_;
        auVar58._16_4_ = fVar25 * auVar35._16_4_;
        auVar58._20_4_ = fVar28 * auVar35._20_4_;
        auVar58._24_4_ = fVar31 * auVar35._24_4_;
        auVar58._28_4_ = local_1660._28_4_;
        auVar100 = vfmsub213ps_fma(auVar35,local_15e0,auVar57);
        auVar89 = vandps_avx(auVar55,auVar96);
        auVar98 = vandps_avx(auVar57,auVar96);
        auVar89 = vcmpps_avx(auVar89,auVar98,1);
        local_1360 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar42),auVar89);
        auVar59._4_4_ = fVar124 * auVar37._4_4_;
        auVar59._0_4_ = fVar121 * auVar37._0_4_;
        auVar59._8_4_ = fVar20 * auVar37._8_4_;
        auVar59._12_4_ = fVar23 * auVar37._12_4_;
        auVar59._16_4_ = fVar26 * auVar37._16_4_;
        auVar59._20_4_ = fVar29 * auVar37._20_4_;
        auVar59._24_4_ = fVar32 * auVar37._24_4_;
        auVar59._28_4_ = auVar89._28_4_;
        auVar42 = vfmsub213ps_fma(auVar37,local_1620,auVar58);
        auVar60._4_4_ = local_1560._4_4_ * fVar122;
        auVar60._0_4_ = local_1560._0_4_ * fVar114;
        auVar60._8_4_ = local_1560._8_4_ * fVar125;
        auVar60._12_4_ = local_1560._12_4_ * fVar21;
        auVar60._16_4_ = local_1560._16_4_ * fVar24;
        auVar60._20_4_ = local_1560._20_4_ * fVar27;
        auVar60._24_4_ = local_1560._24_4_ * fVar30;
        auVar60._28_4_ = auVar98._28_4_;
        auVar100 = vfmsub213ps_fma(local_1580,local_1600,auVar60);
        auVar89 = vandps_avx(auVar60,auVar96);
        auVar98 = vandps_avx(auVar58,auVar96);
        auVar89 = vcmpps_avx(auVar89,auVar98,1);
        local_1340 = vblendvps_avx(ZEXT1632(auVar42),ZEXT1632(auVar100),auVar89);
        auVar42 = vfmsub213ps_fma(local_1560,local_15e0,auVar56);
        auVar100 = vfmsub213ps_fma(auVar34,local_1600,auVar59);
        auVar89 = vandps_avx(auVar56,auVar96);
        auVar98 = vandps_avx(auVar59,auVar96);
        auVar89 = vcmpps_avx(auVar89,auVar98,1);
        local_1320 = vblendvps_avx(ZEXT1632(auVar100),ZEXT1632(auVar42),auVar89);
        auVar42 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        fVar114 = local_1320._0_4_;
        auVar97._0_4_ = fVar114 * fStack_15b0;
        fVar120 = local_1320._4_4_;
        auVar97._4_4_ = fVar120 * fStack_15b0;
        fVar121 = local_1320._8_4_;
        auVar97._8_4_ = fVar121 * fStack_15b0;
        fVar122 = local_1320._12_4_;
        auVar97._12_4_ = fVar122 * fStack_15b0;
        fVar123 = local_1320._16_4_;
        auVar97._16_4_ = fVar123 * fStack_15b0;
        fVar124 = local_1320._20_4_;
        auVar97._20_4_ = fVar124 * fStack_15b0;
        fVar125 = local_1320._24_4_;
        auVar97._24_4_ = fVar125 * fStack_15b0;
        auVar97._28_4_ = 0;
        auVar100 = vfmadd213ps_fma(auVar154,local_1340,auVar97);
        auVar100 = vfmadd213ps_fma(auVar176,local_1360,ZEXT1632(auVar100));
        auVar98 = ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                     CONCAT48(auVar100._8_4_ + auVar100._8_4_,
                                              CONCAT44(auVar100._4_4_ + auVar100._4_4_,
                                                       auVar100._0_4_ + auVar100._0_4_))));
        auVar61._4_4_ = fVar120 * fVar13;
        auVar61._0_4_ = fVar114 * fVar12;
        auVar61._8_4_ = fVar121 * fVar14;
        auVar61._12_4_ = fVar122 * fVar15;
        auVar61._16_4_ = fVar123 * fVar16;
        auVar61._20_4_ = fVar124 * fVar17;
        auVar61._24_4_ = fVar125 * fVar18;
        auVar61._28_4_ = auVar101._28_4_;
        auVar100 = vfmadd213ps_fma(auVar33,local_1340,auVar61);
        auVar2 = vfmadd213ps_fma(local_1820,local_1360,ZEXT1632(auVar100));
        auVar89 = vrcpps_avx(auVar98);
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar147._16_4_ = 0x3f800000;
        auVar147._20_4_ = 0x3f800000;
        auVar147._24_4_ = 0x3f800000;
        auVar147._28_4_ = 0x3f800000;
        auVar100 = vfnmadd213ps_fma(auVar89,auVar98,auVar147);
        auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar89,auVar89);
        local_12a0 = ZEXT1632(CONCAT412(auVar100._12_4_ * (auVar2._12_4_ + auVar2._12_4_),
                                        CONCAT48(auVar100._8_4_ * (auVar2._8_4_ + auVar2._8_4_),
                                                 CONCAT44(auVar100._4_4_ *
                                                          (auVar2._4_4_ + auVar2._4_4_),
                                                          auVar100._0_4_ *
                                                          (auVar2._0_4_ + auVar2._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar133._4_4_ = uVar1;
        auVar133._0_4_ = uVar1;
        auVar133._8_4_ = uVar1;
        auVar133._12_4_ = uVar1;
        auVar133._16_4_ = uVar1;
        auVar133._20_4_ = uVar1;
        auVar133._24_4_ = uVar1;
        auVar133._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1840._4_4_ = uVar1;
        local_1840._0_4_ = uVar1;
        local_1840._8_4_ = uVar1;
        local_1840._12_4_ = uVar1;
        local_1840._16_4_ = uVar1;
        local_1840._20_4_ = uVar1;
        local_1840._24_4_ = uVar1;
        local_1840._28_4_ = uVar1;
        auVar89 = vcmpps_avx(auVar133,local_12a0,2);
        auVar101 = vcmpps_avx(local_12a0,local_1840,2);
        auVar89 = vandps_avx(auVar89,auVar101);
        auVar100 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
        auVar42 = vpand_avx(auVar100,auVar42);
        auVar89 = vpmovsxwd_avx2(auVar42);
        if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar89 >> 0x7f,0) == '\0') &&
              (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar89 >> 0xbf,0) == '\0') &&
            (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar89[0x1f]) goto LAB_01683c65;
        auVar89 = vcmpps_avx(auVar98,_DAT_01f7b000,4);
        auVar100 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
        auVar42 = vpand_avx(auVar42,auVar100);
        local_1300 = vpmovsxwd_avx2(auVar42);
        if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0x7f,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_1300 >> 0xbf,0) == '\0') &&
            (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_1300[0x1f]) goto LAB_01683c65;
        uStack_13b0 = 0;
        uStack_13ac = 0;
        uStack_13a8 = 0;
        uStack_13a4 = 0;
        local_13a0 = ZEXT1632(auVar87);
        local_1220 = local_1420;
        auVar89 = vrcpps_avx(local_1380);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar113._16_4_ = 0x3f800000;
        auVar113._20_4_ = 0x3f800000;
        auVar113._24_4_ = 0x3f800000;
        auVar113._28_4_ = 0x3f800000;
        auVar100 = vfnmadd213ps_fma(local_1380,auVar89,auVar113);
        auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar89,auVar89);
        auVar108._8_4_ = 0x219392ef;
        auVar108._0_8_ = 0x219392ef219392ef;
        auVar108._12_4_ = 0x219392ef;
        auVar108._16_4_ = 0x219392ef;
        auVar108._20_4_ = 0x219392ef;
        auVar108._24_4_ = 0x219392ef;
        auVar108._28_4_ = 0x219392ef;
        auVar89 = vcmpps_avx(local_1660,auVar108,5);
        auVar89 = vandps_avx(auVar89,ZEXT1632(auVar100));
        auVar62._4_4_ = fStack_13bc * auVar89._4_4_;
        auVar62._0_4_ = local_13c0 * auVar89._0_4_;
        auVar62._8_4_ = fStack_13b8 * auVar89._8_4_;
        auVar62._12_4_ = fStack_13b4 * auVar89._12_4_;
        auVar62._16_4_ = auVar89._16_4_ * 0.0;
        auVar62._20_4_ = auVar89._20_4_ * 0.0;
        auVar62._24_4_ = auVar89._24_4_ * 0.0;
        auVar62._28_4_ = 0;
        auVar101 = vminps_avx(auVar62,auVar113);
        auVar63._4_4_ = auVar87._4_4_ * auVar89._4_4_;
        auVar63._0_4_ = auVar87._0_4_ * auVar89._0_4_;
        auVar63._8_4_ = auVar87._8_4_ * auVar89._8_4_;
        auVar63._12_4_ = auVar87._12_4_ * auVar89._12_4_;
        auVar63._16_4_ = auVar89._16_4_ * 0.0;
        auVar63._20_4_ = auVar89._20_4_ * 0.0;
        auVar63._24_4_ = auVar89._24_4_ * 0.0;
        auVar63._28_4_ = local_1620._28_4_;
        auVar89 = vminps_avx(auVar63,auVar113);
        auVar98 = vsubps_avx(auVar113,auVar101);
        auVar33 = vsubps_avx(auVar113,auVar89);
        local_12c0 = vblendvps_avx(auVar89,auVar98,local_1420);
        local_12e0 = vblendvps_avx(auVar101,auVar33,local_1420);
        local_1260._4_4_ = (float)local_1440._4_4_ * local_1340._4_4_;
        local_1260._0_4_ = (float)local_1440._0_4_ * local_1340._0_4_;
        local_1260._8_4_ = fStack_1438 * local_1340._8_4_;
        local_1260._12_4_ = fStack_1434 * local_1340._12_4_;
        local_1260._16_4_ = fStack_1430 * local_1340._16_4_;
        local_1260._20_4_ = fStack_142c * local_1340._20_4_;
        local_1260._24_4_ = fStack_1428 * local_1340._24_4_;
        local_1260._28_4_ = local_12c0._28_4_;
        local_1240._4_4_ = (float)local_1440._4_4_ * fVar120;
        local_1240._0_4_ = (float)local_1440._0_4_ * fVar114;
        local_1240._8_4_ = fStack_1438 * fVar121;
        local_1240._12_4_ = fStack_1434 * fVar122;
        local_1240._16_4_ = fStack_1430 * fVar123;
        local_1240._20_4_ = fStack_142c * fVar124;
        local_1240._24_4_ = fStack_1428 * fVar125;
        local_1240._28_4_ = uStack_1424;
        local_1280[0] = local_1360._0_4_ * (float)local_1440._0_4_;
        local_1280[1] = local_1360._4_4_ * (float)local_1440._4_4_;
        local_1280[2] = local_1360._8_4_ * fStack_1438;
        local_1280[3] = local_1360._12_4_ * fStack_1434;
        fStack_1270 = local_1360._16_4_ * fStack_1430;
        fStack_126c = local_1360._20_4_ * fStack_142c;
        fStack_1268 = local_1360._24_4_ * fStack_1428;
        uStack_1264 = local_12e0._28_4_;
        auVar42 = vpacksswb_avx(auVar42,auVar42);
        uVar64 = (ulong)(byte)(SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar42 >> 0x37,0) & 1) << 6 | SUB161(auVar42 >> 0x3f,0) << 7
                              );
        auVar131 = ZEXT3264(local_16c0);
        auVar134 = ZEXT3264(local_16e0);
        auVar138 = ZEXT3264(local_1700);
        auVar119 = ZEXT3264(local_1680);
        auVar128 = ZEXT3264(local_16a0);
        fStack_15ac = fStack_15b0;
        fStack_15a8 = fStack_15b0;
        fStack_15a4 = fStack_15b0;
        do {
          uVar69 = 0;
          for (uVar73 = uVar64; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
            uVar69 = uVar69 + 1;
          }
          uVar67 = *(uint *)((long)&local_13e0 + uVar69 * 4);
          pGVar8 = (pSVar6->geometries).items[uVar67].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_1820._0_8_ = uVar64;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar64 = (ulong)(uint)((int)uVar69 * 4);
              local_14a0 = *(undefined4 *)(local_12e0 + uVar64);
              uVar1 = *(undefined4 *)(local_12c0 + uVar64);
              local_1490._4_4_ = uVar1;
              local_1490._0_4_ = uVar1;
              local_1490._8_4_ = uVar1;
              local_1490._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar64);
              local_17f0.context = context->user;
              local_1470._4_4_ = uVar67;
              local_1470._0_4_ = uVar67;
              local_1470._8_4_ = uVar67;
              local_1470._12_4_ = uVar67;
              uVar1 = *(undefined4 *)((long)&local_1400 + uVar64);
              local_1480._4_4_ = uVar1;
              local_1480._0_4_ = uVar1;
              local_1480._8_4_ = uVar1;
              local_1480._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1280 + uVar64);
              local_14d0._4_4_ = uVar1;
              local_14d0._0_4_ = uVar1;
              local_14d0._8_4_ = uVar1;
              local_14d0._12_4_ = uVar1;
              local_14c0 = *(undefined4 *)(local_1260 + uVar64);
              local_14b0 = *(undefined4 *)(local_1240 + uVar64);
              vpcmpeqd_avx2(ZEXT1632(local_1470),ZEXT1632(local_1470));
              uStack_145c = (local_17f0.context)->instID[0];
              local_1460 = uStack_145c;
              uStack_1458 = uStack_145c;
              uStack_1454 = uStack_145c;
              uStack_1450 = (local_17f0.context)->instPrimID[0];
              uStack_144c = uStack_1450;
              uStack_1448 = uStack_1450;
              uStack_1444 = uStack_1450;
              local_1890 = *local_1880;
              local_17f0.valid = (int *)local_1890;
              local_17f0.geometryUserPtr = pGVar8->userPtr;
              local_17f0.hit = local_14d0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_14bc = local_14c0;
              uStack_14b8 = local_14c0;
              uStack_14b4 = local_14c0;
              uStack_14ac = local_14b0;
              uStack_14a8 = local_14b0;
              uStack_14a4 = local_14b0;
              uStack_149c = local_14a0;
              uStack_1498 = local_14a0;
              uStack_1494 = local_14a0;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->occlusionFilterN)(&local_17f0);
                auVar138 = ZEXT3264(local_1700);
                auVar134 = ZEXT3264(local_16e0);
                auVar131 = ZEXT3264(local_16c0);
                fVar141 = local_1720;
                fVar144 = fStack_171c;
                fVar148 = fStack_1718;
                fVar149 = fStack_1714;
                fVar150 = fStack_1710;
                fVar151 = fStack_170c;
                fVar152 = fStack_1708;
                fVar142 = local_1740;
                fVar155 = fStack_173c;
                fVar156 = fStack_1738;
                fVar157 = fStack_1734;
                fVar158 = fStack_1730;
                fVar159 = fStack_172c;
                fVar160 = fStack_1728;
                fVar143 = local_1760;
                fVar161 = fStack_175c;
                fVar162 = fStack_1758;
                fVar163 = fStack_1754;
                fVar164 = fStack_1750;
                fVar165 = fStack_174c;
                fVar166 = fStack_1748;
                fVar135 = local_1780;
                fVar168 = fStack_177c;
                fVar169 = fStack_1778;
                fVar170 = fStack_1774;
                fVar171 = fStack_1770;
                fVar172 = fStack_176c;
                fVar173 = fStack_1768;
                fVar139 = local_17a0;
                fVar177 = fStack_179c;
                fVar178 = fStack_1798;
                fVar179 = fStack_1794;
                fVar180 = fStack_1790;
                fVar181 = fStack_178c;
                fVar182 = fStack_1788;
                fVar140 = local_17c0;
                fVar185 = fStack_17bc;
                fVar186 = fStack_17b8;
                fVar187 = fStack_17b4;
                fVar188 = fStack_17b0;
                fVar189 = fStack_17ac;
                fVar190 = fStack_17a8;
              }
              if (local_1890 == (undefined1  [16])0x0) {
                auVar42 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar42 = auVar42 ^ _DAT_01f46b70;
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var11)(&local_17f0);
                  auVar138 = ZEXT3264(local_1700);
                  auVar134 = ZEXT3264(local_16e0);
                  auVar131 = ZEXT3264(local_16c0);
                  fVar141 = local_1720;
                  fVar144 = fStack_171c;
                  fVar148 = fStack_1718;
                  fVar149 = fStack_1714;
                  fVar150 = fStack_1710;
                  fVar151 = fStack_170c;
                  fVar152 = fStack_1708;
                  fVar142 = local_1740;
                  fVar155 = fStack_173c;
                  fVar156 = fStack_1738;
                  fVar157 = fStack_1734;
                  fVar158 = fStack_1730;
                  fVar159 = fStack_172c;
                  fVar160 = fStack_1728;
                  fVar143 = local_1760;
                  fVar161 = fStack_175c;
                  fVar162 = fStack_1758;
                  fVar163 = fStack_1754;
                  fVar164 = fStack_1750;
                  fVar165 = fStack_174c;
                  fVar166 = fStack_1748;
                  fVar135 = local_1780;
                  fVar168 = fStack_177c;
                  fVar169 = fStack_1778;
                  fVar170 = fStack_1774;
                  fVar171 = fStack_1770;
                  fVar172 = fStack_176c;
                  fVar173 = fStack_1768;
                  fVar139 = local_17a0;
                  fVar177 = fStack_179c;
                  fVar178 = fStack_1798;
                  fVar179 = fStack_1794;
                  fVar180 = fStack_1790;
                  fVar181 = fStack_178c;
                  fVar182 = fStack_1788;
                  fVar140 = local_17c0;
                  fVar185 = fStack_17bc;
                  fVar186 = fStack_17b8;
                  fVar187 = fStack_17b4;
                  fVar188 = fStack_17b0;
                  fVar189 = fStack_17ac;
                  fVar190 = fStack_17a8;
                }
                auVar87 = vpcmpeqd_avx(local_1890,_DAT_01f45a50);
                auVar42 = auVar87 ^ _DAT_01f46b70;
                auVar100._8_4_ = 0xff800000;
                auVar100._0_8_ = 0xff800000ff800000;
                auVar100._12_4_ = 0xff800000;
                auVar87 = vblendvps_avx(auVar100,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar87);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar87;
              }
              auVar119 = ZEXT3264(local_1680);
              auVar128 = ZEXT3264(local_16a0);
              auVar87._8_8_ = 0x100000001;
              auVar87._0_8_ = 0x100000001;
              if ((auVar87 & auVar42) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = local_1840._0_4_;
                uVar64 = local_1820._0_8_ ^ 1L << (uVar69 & 0x3f);
                goto LAB_01683bf6;
              }
            }
            *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
            goto LAB_01683d15;
          }
          uVar64 = uVar64 ^ 1L << (uVar69 & 0x3f);
LAB_01683bf6:
        } while (uVar64 != 0);
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }